

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_ts2cb(char *fn)

{
  int iVar1;
  ulong uVar2;
  uint32 n_ts;
  uint32 *map;
  uint32 n_cb;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x60,"Reading %s\n",fn);
  iVar1 = s3ts2cb_read(fn,&map,&n_ts,&n_cb);
  if (iVar1 == 0) {
    iVar1 = 0;
    for (uVar2 = 0; uVar2 < n_ts; uVar2 = uVar2 + 1) {
      printf("%d: %d\n",uVar2 & 0xffffffff,(ulong)map[uVar2]);
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
print_ts2cb(const char *fn)
{
    uint32 *map;
    uint32 n_ts, n_cb;
    uint32 i;

    E_INFO("Reading %s\n",  fn);

    if (s3ts2cb_read(fn, &map, &n_ts, &n_cb) != S3_SUCCESS)
	return S3_ERROR;

    for (i = 0; i < n_ts; i++) {
	printf("%d: %d\n", i, map[i]);
    }

    return S3_SUCCESS;
}